

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

aiNode * ImportNode(aiScene *pScene,Asset *r,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets,
                   Ref<glTF2::Node> *ptr)

{
  char *pcVar1;
  float fVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  aiMesh *paVar7;
  Skin *pSVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong *puVar14;
  long *plVar15;
  Light *pLVar16;
  _Alloc_hider _Var17;
  size_type sVar18;
  aiScene *pScene_00;
  pointer pvVar19;
  int iVar20;
  aiNode *this;
  ulong uVar21;
  aiNode **ppaVar22;
  aiNode *paVar23;
  uint *puVar24;
  aiBone **ppaVar25;
  aiBone *paVar26;
  aiVertexWeight *paVar27;
  vector<glTF2::Light_*,_std::allocator<glTF2::Light_*>_> *pvVar28;
  aiMetadata *paVar29;
  aiString *paVar30;
  aiMetadataEntry *paVar31;
  float *pfVar32;
  long lVar33;
  char *pcVar34;
  void *pvVar35;
  void *pvVar36;
  long lVar37;
  ulong uVar38;
  pointer puVar39;
  uint uVar40;
  ulong uVar41;
  char *pcVar42;
  bool bVar43;
  Node *node;
  int j;
  ulong uVar44;
  void *pvVar45;
  void *pvVar46;
  bool bVar47;
  bool bVar48;
  float weight;
  char postfix [10];
  mat4 *pbindMatrices;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  weighting;
  void *local_e0;
  string local_d8;
  undefined8 local_b8;
  undefined2 local_b0;
  aiScene *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  long *local_98;
  long local_90;
  Node *local_88;
  float (*local_80) [16];
  aiNode *local_78;
  long *local_70;
  aiMesh *local_68;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  local_60;
  void *local_48;
  ulong local_40;
  ulong local_38;
  
  node = (ptr->vector->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
         super__Vector_impl_data._M_start[ptr->index];
  local_a8 = pScene;
  local_a0 = meshOffsets;
  this = (aiNode *)operator_new(0x478);
  uVar21 = (ulong)((node->super_Object).name._M_string_length != 0);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  lVar37 = *(long *)((node->matrix).value + uVar21 * 8 + -0x1c);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,lVar37,
             *(long *)((node->matrix).value + uVar21 * 8 + -0x1a) + lVar37);
  aiNode::aiNode(this,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pScene_00 = local_a8;
  pRVar3 = (node->children).
           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (node->children).
           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 != pRVar4) {
    uVar21 = (long)pRVar4 - (long)pRVar3;
    uVar40 = (uint)(uVar21 >> 4);
    this->mNumChildren = uVar40;
    ppaVar22 = (aiNode **)operator_new__(uVar21 >> 1 & 0x7fffffff8);
    this->mChildren = ppaVar22;
    if (uVar40 != 0) {
      lVar37 = 0;
      uVar21 = 0;
      do {
        paVar23 = ImportNode(pScene_00,r,local_a0,
                             (Ref<glTF2::Node> *)
                             ((long)&((node->children).
                                      super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->vector + lVar37));
        paVar23->mParent = this;
        this->mChildren[uVar21] = paVar23;
        uVar21 = uVar21 + 1;
        lVar37 = lVar37 + 0x10;
      } while (uVar21 < this->mNumChildren);
    }
  }
  GetNodeTransform(&this->mTransformation,node);
  pRVar5 = (node->meshes).
           super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar6 = (node->meshes).
           super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar5 != pRVar6) {
    local_78 = this;
    if ((long)pRVar6 - (long)pRVar5 != 0x10) {
      __assert_fail("node.meshes.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                    ,0x375,
                    "aiNode *ImportNode(aiScene *, glTF2::Asset &, std::vector<unsigned int> &, glTF2::Ref<glTF2::Node> &)"
                   );
    }
    local_90 = (long)(int)pRVar5->index;
    puVar39 = (local_a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar40 = puVar39[local_90 + 1] - puVar39[local_90];
    this->mNumMeshes = uVar40;
    uVar21 = 0xffffffffffffffff;
    if (-1 < (int)uVar40) {
      uVar21 = (long)(int)uVar40 * 4;
    }
    puVar24 = (uint *)operator_new__(uVar21);
    this->mMeshes = puVar24;
    if (((node->skin).vector != (vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *)0x0) &&
       (0 < (int)uVar40)) {
      local_40 = (ulong)uVar40;
      uVar21 = 0;
      local_88 = node;
      do {
        paVar7 = local_a8->mMeshes
                 [(local_a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start[local_90] + (int)uVar21];
        pSVar8 = (((node->skin).vector)->
                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[(node->skin).index];
        uVar41 = (long)*(pointer *)
                        ((long)&(pSVar8->jointNames).
                                super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                        + 8) -
                 *(long *)&(pSVar8->jointNames).
                           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                           ._M_impl;
        paVar7->mNumBones = (uint)(uVar41 >> 4);
        ppaVar25 = (aiBone **)operator_new__(uVar41 >> 1 & 0x7fffffff8);
        paVar7->mBones = ppaVar25;
        local_68 = paVar7;
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::vector(&local_60,(ulong)paVar7->mNumBones,(allocator_type *)&local_d8);
        pRVar5 = (node->meshes).
                 super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar37 = *(long *)(*(long *)(*(long *)&(pRVar5->vector->
                                               super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                               )._M_impl + (ulong)pRVar5->index * 8) + 0x50);
        lVar33 = uVar21 * 0x100;
        puVar9 = *(undefined8 **)(lVar37 + 0xb0 + lVar33);
        local_38 = uVar21;
        if (puVar9 != *(undefined8 **)(lVar37 + 0xb8 + lVar33)) {
          lVar37 = lVar37 + lVar33;
          puVar10 = *(undefined8 **)(lVar37 + 0x80);
          if (puVar10 != *(undefined8 **)(lVar37 + 0x88)) {
            lVar33 = *(long *)(*(long *)*puVar9 + (ulong)*(uint *)(puVar9 + 1) * 8);
            local_70 = *(long **)(lVar33 + 0x70);
            if (local_70 ==
                *(long **)(*(long *)(*(long *)*puVar10 + (ulong)*(uint *)(puVar10 + 1) * 8) + 0x70))
            {
              if (*(long **)(lVar33 + 0x50) == (long *)0x0) {
LAB_00620227:
                local_e0 = (void *)0x0;
              }
              else {
                lVar11 = *(long *)(**(long **)(lVar33 + 0x50) + (ulong)*(uint *)(lVar33 + 0x58) * 8)
                ;
                if (*(long **)(lVar11 + 0x50) == (long *)0x0) goto LAB_00620227;
                lVar12 = *(long *)(**(long **)(lVar11 + 0x50) + (ulong)*(uint *)(lVar11 + 0x58) * 8)
                ;
                lVar13 = *(long *)(lVar12 + 0x70);
                if (lVar13 == 0) goto LAB_00620227;
                uVar21 = *(long *)(lVar11 + 0x60) + *(long *)(lVar33 + 0x60);
                puVar14 = *(ulong **)(lVar12 + 0x68);
                if (puVar14 == (ulong *)0x0) {
LAB_0062015c:
                  pvVar35 = (void *)(lVar13 + uVar21);
                }
                else {
                  uVar41 = *puVar14;
                  if ((uVar21 < uVar41) || (uVar41 + puVar14[3] <= uVar21)) goto LAB_0062015c;
                  pvVar35 = (void *)((uVar21 - uVar41) + puVar14[2]);
                }
                if (pvVar35 == (void *)0x0) goto LAB_00620227;
                iVar20 = *(int *)(&DAT_007db158 + (ulong)*(uint *)(lVar33 + 0x78) * 0x10);
                uVar40 = glTF2::ComponentTypeSize(*(ComponentType *)(lVar33 + 0x68));
                uVar40 = uVar40 * iVar20;
                uVar41 = (ulong)uVar40;
                plVar15 = *(long **)(lVar33 + 0x50);
                uVar21 = uVar41;
                if ((plVar15 != (long *)0x0) &&
                   (uVar21 = (ulong)*(uint *)(*(long *)(*plVar15 +
                                                       (ulong)*(uint *)(lVar33 + 0x58) * 8) + 0x70),
                   uVar21 == 0)) {
                  uVar21 = uVar41;
                }
                if (0x10 < uVar40) {
                  pcVar34 = "bool glTF2::Accessor::ExtractData(T *&) [T = Weights]";
                  goto LAB_00620e24;
                }
                uVar38 = *(ulong *)(lVar33 + 0x70);
                uVar44 = *(ulong *)(*(long *)(*plVar15 + (ulong)*(uint *)(lVar33 + 0x58) * 8) + 0x68
                                   );
                if (uVar44 <= uVar21 * uVar38 && uVar21 * uVar38 - uVar44 != 0) {
                  pcVar34 = "bool glTF2::Accessor::ExtractData(T *&) [T = Weights]";
                  goto LAB_00620e43;
                }
                local_e0 = operator_new__(-(ulong)(uVar38 >> 0x3c != 0) | uVar38 << 4);
                pvVar36 = local_e0;
                if ((uVar40 == 0x10) && ((int)uVar21 == 0x10)) {
                  memcpy(local_e0,pvVar35,uVar38 * uVar41);
                }
                else {
                  for (; uVar38 != 0; uVar38 = uVar38 - 1) {
                    memcpy(pvVar36,pvVar35,uVar41);
                    pvVar35 = (void *)((long)pvVar35 + uVar21);
                    pvVar36 = (void *)((long)pvVar36 + 0x10);
                  }
                }
              }
              lVar33 = *(long *)(*(long *)**(undefined8 **)(lVar37 + 0x80) +
                                (ulong)*(uint *)(*(undefined8 **)(lVar37 + 0x80) + 1) * 8);
              iVar20 = *(int *)(&DAT_007db158 + (ulong)*(uint *)(lVar33 + 0x78) * 0x10);
              uVar40 = glTF2::ComponentTypeSize(*(ComponentType *)(lVar33 + 0x68));
              lVar37 = *(long *)(*(long *)**(undefined8 **)(lVar37 + 0x80) +
                                (ulong)*(uint *)(*(undefined8 **)(lVar37 + 0x80) + 1) * 8);
              plVar15 = *(long **)(lVar37 + 0x50);
              if (uVar40 * iVar20 == 4) {
                if (plVar15 == (long *)0x0) goto LAB_00620d72;
                lVar33 = *(long *)(*plVar15 + (ulong)*(uint *)(lVar37 + 0x58) * 8);
                if (*(long **)(lVar33 + 0x50) == (long *)0x0) goto LAB_00620d72;
                lVar11 = *(long *)(**(long **)(lVar33 + 0x50) + (ulong)*(uint *)(lVar33 + 0x58) * 8)
                ;
                lVar12 = *(long *)(lVar11 + 0x70);
                if (lVar12 == 0) goto LAB_00620d72;
                uVar21 = *(long *)(lVar33 + 0x60) + *(long *)(lVar37 + 0x60);
                puVar14 = *(ulong **)(lVar11 + 0x68);
                if (puVar14 == (ulong *)0x0) {
LAB_00620361:
                  pvVar36 = (void *)(lVar12 + uVar21);
                }
                else {
                  uVar41 = *puVar14;
                  if ((uVar21 < uVar41) || (uVar41 + puVar14[3] <= uVar21)) goto LAB_00620361;
                  pvVar36 = (void *)((uVar21 - uVar41) + puVar14[2]);
                }
                if (pvVar36 == (void *)0x0) {
LAB_00620d72:
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                                ,0x347,
                                "void BuildVertexWeightMapping(Mesh::Primitive &, std::vector<std::vector<aiVertexWeight>> &)"
                               );
                }
                iVar20 = *(int *)(&DAT_007db158 + (ulong)*(uint *)(lVar37 + 0x78) * 0x10);
                uVar40 = glTF2::ComponentTypeSize(*(ComponentType *)(lVar37 + 0x68));
                uVar40 = uVar40 * iVar20;
                uVar41 = (ulong)uVar40;
                plVar15 = *(long **)(lVar37 + 0x50);
                uVar21 = uVar41;
                if ((plVar15 != (long *)0x0) &&
                   (uVar21 = (ulong)*(uint *)(*(long *)(*plVar15 +
                                                       (ulong)*(uint *)(lVar37 + 0x58) * 8) + 0x70),
                   uVar21 == 0)) {
                  uVar21 = uVar41;
                }
                if (4 < uVar40) {
                  pcVar34 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices8]";
LAB_00620e24:
                  __assert_fail("elemSize <= targetElemSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Asset.inl"
                                ,0x28a,pcVar34);
                }
                uVar38 = *(ulong *)(lVar37 + 0x70);
                uVar44 = *(ulong *)(*(long *)(*plVar15 + (ulong)*(uint *)(lVar37 + 0x58) * 8) + 0x68
                                   );
                if (uVar44 <= uVar21 * uVar38 && uVar21 * uVar38 - uVar44 != 0) {
                  pcVar34 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices8]";
LAB_00620e43:
                  __assert_fail("count*stride <= bufferView->byteLength",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Asset.inl"
                                ,0x28c,pcVar34);
                }
                pvVar35 = operator_new__(-(ulong)(uVar38 >> 0x3e != 0) | uVar38 * 4);
                if ((uVar40 == 4) && ((int)uVar21 == 4)) {
                  memcpy(pvVar35,pvVar36,uVar38 * uVar41);
                }
                else if (uVar38 != 0) {
                  uVar44 = 0;
                  do {
                    memcpy((void *)((long)pvVar35 + uVar44 * 4),pvVar36,uVar41);
                    uVar44 = uVar44 + 1;
                    pvVar36 = (void *)((long)pvVar36 + uVar21);
                  } while (uVar38 != uVar44);
                }
                pvVar36 = (void *)0x0;
              }
              else {
                if (plVar15 == (long *)0x0) goto LAB_00620d72;
                lVar33 = *(long *)(*plVar15 + (ulong)*(uint *)(lVar37 + 0x58) * 8);
                if (*(long **)(lVar33 + 0x50) == (long *)0x0) goto LAB_00620d72;
                lVar11 = *(long *)(**(long **)(lVar33 + 0x50) + (ulong)*(uint *)(lVar33 + 0x58) * 8)
                ;
                lVar12 = *(long *)(lVar11 + 0x70);
                if (lVar12 == 0) goto LAB_00620d72;
                uVar21 = *(long *)(lVar33 + 0x60) + *(long *)(lVar37 + 0x60);
                puVar14 = *(ulong **)(lVar11 + 0x68);
                if (puVar14 == (ulong *)0x0) {
LAB_00620427:
                  pvVar35 = (void *)(lVar12 + uVar21);
                }
                else {
                  uVar41 = *puVar14;
                  if ((uVar21 < uVar41) || (uVar41 + puVar14[3] <= uVar21)) goto LAB_00620427;
                  pvVar35 = (void *)((uVar21 - uVar41) + puVar14[2]);
                }
                if (pvVar35 == (void *)0x0) goto LAB_00620d72;
                iVar20 = *(int *)(&DAT_007db158 + (ulong)*(uint *)(lVar37 + 0x78) * 0x10);
                uVar40 = glTF2::ComponentTypeSize(*(ComponentType *)(lVar37 + 0x68));
                uVar40 = uVar40 * iVar20;
                uVar41 = (ulong)uVar40;
                plVar15 = *(long **)(lVar37 + 0x50);
                uVar21 = uVar41;
                if ((plVar15 != (long *)0x0) &&
                   (uVar21 = (ulong)*(uint *)(*(long *)(*plVar15 +
                                                       (ulong)*(uint *)(lVar37 + 0x58) * 8) + 0x70),
                   uVar21 == 0)) {
                  uVar21 = uVar41;
                }
                if (8 < uVar40) {
                  pcVar34 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices16]";
                  goto LAB_00620e24;
                }
                uVar38 = *(ulong *)(lVar37 + 0x70);
                uVar44 = *(ulong *)(*(long *)(*plVar15 + (ulong)*(uint *)(lVar37 + 0x58) * 8) + 0x68
                                   );
                if (uVar44 <= uVar21 * uVar38 && uVar21 * uVar38 - uVar44 != 0) {
                  pcVar34 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices16]";
                  goto LAB_00620e43;
                }
                pvVar36 = operator_new__(-(ulong)(uVar38 >> 0x3d != 0) | uVar38 * 8);
                if ((uVar40 == 8) && ((int)uVar21 == 8)) {
                  memcpy(pvVar36,pvVar35,uVar38 * uVar41);
                }
                else if (uVar38 != 0) {
                  uVar44 = 0;
                  do {
                    memcpy((void *)(uVar44 * 8 + (long)pvVar36),pvVar35,uVar41);
                    uVar44 = uVar44 + 1;
                    pvVar35 = (void *)((long)pvVar35 + uVar21);
                  } while (uVar38 != uVar44);
                }
                pvVar35 = (void *)0x0;
              }
              local_48 = pvVar36;
              if (local_70 == (long *)0x0) {
                if (local_e0 != (void *)0x0) goto LAB_00620622;
              }
              else {
                local_98 = (long *)0x0;
                pvVar45 = pvVar35;
                pvVar46 = local_e0;
                do {
                  lVar37 = 0;
                  do {
                    if (pvVar35 == (void *)0x0) {
                      uVar21 = (ulong)*(ushort *)((long)pvVar36 + lVar37 * 2);
                    }
                    else {
                      uVar21 = (ulong)*(byte *)((long)pvVar45 + lVar37);
                    }
                    fVar2 = *(float *)((long)pvVar46 + lVar37 * 4);
                    local_d8._M_dataplus._M_p._0_4_ = fVar2;
                    if ((0.0 < fVar2) &&
                       (uVar21 < (ulong)(((long)local_60.
                                                super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_60.
                                                super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                        -0x5555555555555555))) {
                      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                                (local_60.
                                 super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar21,8);
                      local_b8 = CONCAT44(local_b8._4_4_,(int)local_98);
                      std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                      emplace_back<unsigned_int,float_const&>
                                ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)
                                 ((long)&((local_60.
                                           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                         )._M_impl.super__Vector_impl_data._M_start +
                                 (ulong)(uint)((int)uVar21 * 0x18)),(uint *)&local_b8,
                                 (float *)&local_d8);
                    }
                    lVar37 = lVar37 + 1;
                  } while (lVar37 != 4);
                  local_98 = (long *)((long)local_98 + 1);
                  pvVar36 = (void *)((long)pvVar36 + 8);
                  pvVar46 = (void *)((long)pvVar46 + 0x10);
                  pvVar45 = (void *)((long)pvVar45 + 4);
                } while (local_98 != local_70);
LAB_00620622:
                operator_delete__(local_e0);
              }
              if (pvVar35 != (void *)0x0) {
                operator_delete__(pvVar35);
              }
              node = local_88;
              if (local_48 != (void *)0x0) {
                operator_delete__(local_48);
              }
            }
          }
        }
        local_80 = (float (*) [16])0x0;
        pSVar8 = (((node->skin).vector)->
                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[(node->skin).index];
        glTF2::Accessor::ExtractData<float[16]>
                  (*(Accessor **)
                    (*(long *)&((pSVar8->inverseBindMatrices).vector)->
                               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                    + (ulong)(pSVar8->inverseBindMatrices).index * 8),&local_80);
        if (local_68->mNumBones != 0) {
          uVar21 = 0;
          do {
            paVar26 = (aiBone *)operator_new(0x450);
            (paVar26->mName).length = 0;
            pcVar34 = (paVar26->mName).data;
            (paVar26->mName).data[0] = '\0';
            memset((paVar26->mName).data + 1,0x1b,0x3ff);
            paVar26->mNumWeights = 0;
            paVar26->mWeights = (aiVertexWeight *)0x0;
            (paVar26->mOffsetMatrix).a1 = 1.0;
            (paVar26->mOffsetMatrix).a2 = 0.0;
            (paVar26->mOffsetMatrix).a3 = 0.0;
            (paVar26->mOffsetMatrix).a4 = 0.0;
            (paVar26->mOffsetMatrix).b1 = 0.0;
            (paVar26->mOffsetMatrix).b2 = 1.0;
            (paVar26->mOffsetMatrix).b3 = 0.0;
            (paVar26->mOffsetMatrix).b4 = 0.0;
            (paVar26->mOffsetMatrix).c1 = 0.0;
            (paVar26->mOffsetMatrix).c2 = 0.0;
            (paVar26->mOffsetMatrix).c3 = 1.0;
            (paVar26->mOffsetMatrix).c4 = 0.0;
            (paVar26->mOffsetMatrix).d1 = 0.0;
            (paVar26->mOffsetMatrix).d2 = 0.0;
            (paVar26->mOffsetMatrix).d3 = 0.0;
            (paVar26->mOffsetMatrix).d4 = 1.0;
            lVar37 = *(long *)&((((node->skin).vector)->
                                super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
                                _M_impl.super__Vector_impl_data._M_start[(node->skin).index]->
                               jointNames).
                               super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                               ._M_impl;
            local_98 = *(long **)(lVar37 + uVar21 * 0x10);
            uVar38 = (ulong)*(uint *)(lVar37 + 8 + uVar21 * 0x10);
            lVar37 = *(long *)(*local_98 + uVar38 * 8);
            uVar41 = *(ulong *)(lVar37 + 0x38);
            if (uVar41 == 0) {
              if ((ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                   ::kDefaultName_abi_cxx11_ == '\0') &&
                 (iVar20 = __cxa_guard_acquire(&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                                ::kDefaultName_abi_cxx11_), iVar20 != 0)) {
                ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                ::kDefaultName_abi_cxx11_._M_dataplus._M_p =
                     (pointer)&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                               ::kDefaultName_abi_cxx11_.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)
                           &ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                            ::kDefaultName_abi_cxx11_,"bone_","");
                __cxa_atexit(std::__cxx11::string::~string,
                             &ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                              ::kDefaultName_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                     ::kDefaultName_abi_cxx11_);
              }
              local_b0 = 0;
              local_b8 = 0;
              uVar40 = 1;
              if ((int)uVar21 < 0) {
                local_b8 = 0x2d;
                uVar41 = (ulong)(uint)-(int)uVar21;
                uVar40 = 2;
                pcVar42 = (char *)((long)&local_b8 + 1);
              }
              else {
                pcVar42 = (char *)&local_b8;
                uVar41 = uVar21 & 0xffffffff;
              }
              iVar20 = 1000000000;
              bVar43 = false;
              do {
                lVar37 = (long)(int)uVar41 / (long)iVar20;
                bVar47 = (int)lVar37 != 0;
                bVar48 = iVar20 == 1;
                if ((bVar43 || bVar48) || bVar47) {
                  pcVar1 = pcVar42 + 1;
                  *pcVar42 = (char)lVar37 + '0';
                  pcVar42 = pcVar1;
                  if (iVar20 == 1) break;
                  uVar40 = uVar40 + 1;
                  uVar41 = (long)(int)uVar41 % (long)iVar20 & 0xffffffff;
                }
                iVar20 = iVar20 / 10;
                bVar43 = (bool)(bVar43 | bVar48 | bVar47);
              } while (uVar40 < 10);
              *pcVar42 = '\0';
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,
                         ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                         ::kDefaultName_abi_cxx11_._M_dataplus._M_p,
                         ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                         ::kDefaultName_abi_cxx11_._M_dataplus._M_p +
                         ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                         ::kDefaultName_abi_cxx11_._M_string_length);
              std::__cxx11::string::append((char *)&local_d8);
              sVar18 = local_d8._M_string_length;
              _Var17._M_p = local_d8._M_dataplus._M_p;
              if (local_d8._M_string_length < 0x400) {
                (paVar26->mName).length = (ai_uint32)local_d8._M_string_length;
                memcpy(pcVar34,local_d8._M_dataplus._M_p,local_d8._M_string_length);
                (paVar26->mName).data[sVar18] = '\0';
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var17._M_p != &local_d8.field_2) {
                operator_delete(_Var17._M_p,local_d8.field_2._M_allocated_capacity + 1);
              }
            }
            else if (uVar41 < 0x400) {
              (paVar26->mName).length = (ai_uint32)uVar41;
              memcpy(pcVar34,*(void **)(lVar37 + 0x30),uVar41);
              (paVar26->mName).data[uVar41] = '\0';
            }
            GetNodeTransform(&paVar26->mOffsetMatrix,*(Node **)(*local_98 + uVar38 * 8));
            pvVar19 = local_60.
                      super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            (paVar26->mOffsetMatrix).a1 = local_80[uVar21][0];
            (paVar26->mOffsetMatrix).b1 = local_80[uVar21][1];
            (paVar26->mOffsetMatrix).c1 = local_80[uVar21][2];
            (paVar26->mOffsetMatrix).d1 = local_80[uVar21][3];
            (paVar26->mOffsetMatrix).a2 = local_80[uVar21][4];
            (paVar26->mOffsetMatrix).b2 = local_80[uVar21][5];
            (paVar26->mOffsetMatrix).c2 = local_80[uVar21][6];
            (paVar26->mOffsetMatrix).d2 = local_80[uVar21][7];
            (paVar26->mOffsetMatrix).a3 = local_80[uVar21][8];
            (paVar26->mOffsetMatrix).b3 = local_80[uVar21][9];
            (paVar26->mOffsetMatrix).c3 = local_80[uVar21][10];
            (paVar26->mOffsetMatrix).d3 = local_80[uVar21][0xb];
            (paVar26->mOffsetMatrix).a4 = local_80[uVar21][0xc];
            (paVar26->mOffsetMatrix).b4 = local_80[uVar21][0xd];
            (paVar26->mOffsetMatrix).c4 = local_80[uVar21][0xe];
            (paVar26->mOffsetMatrix).d4 = local_80[uVar21][0xf];
            uVar41 = (long)local_60.
                           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].
                           super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_60.
                           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].
                           super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            uVar40 = (uint)(uVar41 >> 3);
            paVar26->mNumWeights = uVar40;
            if (uVar40 == 0) {
              paVar27 = (aiVertexWeight *)operator_new__(8);
              paVar26->mWeights = paVar27;
              paVar26->mNumWeights = 1;
              paVar27->mVertexId = 0;
              paVar27->mWeight = 0.0;
            }
            else {
              uVar41 = uVar41 & 0x7fffffff8;
              paVar27 = (aiVertexWeight *)operator_new__(uVar41);
              memset(paVar27,0,uVar41);
              paVar26->mWeights = paVar27;
              memcpy(paVar27,pvVar19[uVar21].
                             super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                             _M_impl.super__Vector_impl_data._M_start,uVar41);
            }
            local_68->mBones[uVar21] = paVar26;
            uVar21 = uVar21 + 1;
            node = local_88;
          } while (uVar21 < local_68->mNumBones);
        }
        if (local_80 != (float (*) [16])0x0) {
          operator_delete__(local_80);
        }
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::~vector(&local_60);
        uVar21 = local_38 + 1;
      } while (uVar21 != local_40);
      puVar39 = (local_a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    uVar40 = puVar39[local_90];
    this = local_78;
    if (uVar40 < puVar39[local_90 + 1]) {
      lVar37 = 0;
      do {
        local_78->mMeshes[lVar37] = uVar40 + (int)lVar37;
        lVar37 = lVar37 + 1;
      } while ((int)lVar37 + uVar40 <
               (local_a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[local_90 + 1]);
    }
  }
  if (((node->camera).vector != (vector<glTF2::Camera_*,_std::allocator<glTF2::Camera_*>_> *)0x0) &&
     (paVar23 = (aiNode *)local_a8->mCameras[(node->camera).index], paVar23 != this)) {
    uVar40 = (this->mName).length;
    (paVar23->mName).length = uVar40;
    memcpy((paVar23->mName).data,(this->mName).data,(ulong)uVar40);
    (paVar23->mName).data[uVar40] = '\0';
  }
  pvVar28 = (node->light).vector;
  if (pvVar28 != (vector<glTF2::Light_*,_std::allocator<glTF2::Light_*>_> *)0x0) {
    uVar21 = (ulong)(node->light).index;
    paVar23 = (aiNode *)local_a8->mLights[uVar21];
    if (paVar23 != this) {
      uVar40 = (this->mName).length;
      (paVar23->mName).length = uVar40;
      memcpy((paVar23->mName).data,(this->mName).data,(ulong)uVar40);
      (paVar23->mName).data[uVar40] = '\0';
      pvVar28 = (node->light).vector;
      uVar21 = (ulong)(node->light).index;
    }
    if (((pvVar28->super__Vector_base<glTF2::Light_*,_std::allocator<glTF2::Light_*>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar21]->range).isPresent == true) {
      paVar29 = (aiMetadata *)operator_new(0x18);
      paVar29->mNumProperties = 1;
      paVar30 = (aiString *)operator_new__(0x404);
      paVar30->length = 0;
      paVar30->data[0] = '\0';
      memset(paVar30->data + 1,0x1b,0x3ff);
      paVar29->mKeys = paVar30;
      paVar31 = (aiMetadataEntry *)operator_new__(0x10);
      *(undefined8 *)paVar31 = 0;
      paVar31->mData = (void *)0x0;
      paVar29->mValues = paVar31;
      this->mMetaData = paVar29;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"PBR_LightRange","");
      if ((paVar29->mNumProperties != 0) && (local_d8._M_string_length != 0)) {
        pLVar16 = (((node->light).vector)->
                  super__Vector_base<glTF2::Light_*,_std::allocator<glTF2::Light_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[(node->light).index];
        if (local_d8._M_string_length < 0x400) {
          paVar30 = paVar29->mKeys;
          paVar30->length = (ai_uint32)local_d8._M_string_length;
          memcpy(paVar30->data,local_d8._M_dataplus._M_p,local_d8._M_string_length);
          paVar30->data[local_d8._M_string_length] = '\0';
        }
        paVar29->mValues->mType = AI_FLOAT;
        pfVar32 = (float *)operator_new(4);
        *pfVar32 = (pLVar16->range).value;
        paVar29->mValues->mData = pfVar32;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return this;
}

Assistant:

aiNode* ImportNode(aiScene* pScene, glTF2::Asset& r, std::vector<unsigned int>& meshOffsets, glTF2::Ref<glTF2::Node>& ptr)
{
    Node& node = *ptr;

    aiNode* ainode = new aiNode(GetNodeName(node));

    if (!node.children.empty()) {
        ainode->mNumChildren = unsigned(node.children.size());
        ainode->mChildren = new aiNode*[ainode->mNumChildren];

        for (unsigned int i = 0; i < ainode->mNumChildren; ++i) {
            aiNode* child = ImportNode(pScene, r, meshOffsets, node.children[i]);
            child->mParent = ainode;
            ainode->mChildren[i] = child;
        }
    }

    GetNodeTransform(ainode->mTransformation, node);

    if (!node.meshes.empty()) {
        // GLTF files contain at most 1 mesh per node.
        assert(node.meshes.size() == 1);
        int mesh_idx = node.meshes[0].GetIndex();
        int count = meshOffsets[mesh_idx + 1] - meshOffsets[mesh_idx];

        ainode->mNumMeshes = count;
        ainode->mMeshes = new unsigned int[count];

        if (node.skin) {
            for (int primitiveNo = 0; primitiveNo < count; ++primitiveNo) {
                aiMesh* mesh = pScene->mMeshes[meshOffsets[mesh_idx]+primitiveNo];
                mesh->mNumBones = static_cast<unsigned int>(node.skin->jointNames.size());
                mesh->mBones = new aiBone*[mesh->mNumBones];

                // GLTF and Assimp choose to store bone weights differently.
                // GLTF has each vertex specify which bones influence the vertex.
                // Assimp has each bone specify which vertices it has influence over.
                // To convert this data, we first read over the vertex data and pull
                // out the bone-to-vertex mapping.  Then, when creating the aiBones,
                // we copy the bone-to-vertex mapping into the bone.  This is unfortunate
                // both because it's somewhat slow and because, for many applications,
                // we then need to reconvert the data back into the vertex-to-bone
                // mapping which makes things doubly-slow.
                std::vector<std::vector<aiVertexWeight>> weighting(mesh->mNumBones);
                BuildVertexWeightMapping(node.meshes[0]->primitives[primitiveNo], weighting);

                mat4* pbindMatrices = nullptr;
                node.skin->inverseBindMatrices->ExtractData(pbindMatrices);

                for (uint32_t i = 0; i < mesh->mNumBones; ++i) {
                    aiBone* bone = new aiBone();

                    Ref<Node> joint = node.skin->jointNames[i];
                    if (!joint->name.empty()) {
                      bone->mName = joint->name;
                    } else {
                      // Assimp expects each bone to have a unique name.
                      static const std::string kDefaultName = "bone_";
                      char postfix[10] = {0};
                      ASSIMP_itoa10(postfix, i);
                      bone->mName = (kDefaultName + postfix);
                    }
                    GetNodeTransform(bone->mOffsetMatrix, *joint);

                    CopyValue(pbindMatrices[i], bone->mOffsetMatrix);

                    std::vector<aiVertexWeight>& weights = weighting[i];

                    bone->mNumWeights = static_cast<uint32_t>(weights.size());
                    if (bone->mNumWeights > 0) {
                      bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                      memcpy(bone->mWeights, weights.data(), bone->mNumWeights * sizeof(aiVertexWeight));
                    } else {
                      // Assimp expects all bones to have at least 1 weight.
                      bone->mWeights = new aiVertexWeight[1];
                      bone->mNumWeights = 1;
                      bone->mWeights->mVertexId = 0;
                      bone->mWeights->mWeight = 0.f;
                    }
                    mesh->mBones[i] = bone;
                }

                if (pbindMatrices) {
                    delete[] pbindMatrices;
                }
            }
        }

        int k = 0;
        for (unsigned int j = meshOffsets[mesh_idx]; j < meshOffsets[mesh_idx + 1]; ++j, ++k) {
            ainode->mMeshes[k] = j;
        }
    }

    if (node.camera) {
        pScene->mCameras[node.camera.GetIndex()]->mName = ainode->mName;
    }

    if (node.light) {
        pScene->mLights[node.light.GetIndex()]->mName = ainode->mName;

        //range is optional - see https://github.com/KhronosGroup/glTF/tree/master/extensions/2.0/Khronos/KHR_lights_punctual
        //it is added to meta data of parent node, because there is no other place to put it
        if (node.light->range.isPresent)
        {
            ainode->mMetaData = aiMetadata::Alloc(1);
            ainode->mMetaData->Set(0, "PBR_LightRange", node.light->range.value);
        }
    }

    return ainode;
}